

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# remap_struct.cpp
# Opt level: O1

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::RemapStructBindData::Copy(RemapStructBindData *this)

{
  _func_int **pp_Var1;
  long in_RSI;
  vector<duckdb::RemapColumnInfo,_std::allocator<duckdb::RemapColumnInfo>_> local_38;
  
  pp_Var1 = (_func_int **)operator_new(0x20);
  ::std::vector<duckdb::RemapColumnInfo,_std::allocator<duckdb::RemapColumnInfo>_>::vector
            (&local_38,
             (vector<duckdb::RemapColumnInfo,_std::allocator<duckdb::RemapColumnInfo>_> *)
             (in_RSI + 8));
  *pp_Var1 = (_func_int *)&PTR__RemapStructBindData_02487c48;
  pp_Var1[1] = (_func_int *)
               local_38.
               super__Vector_base<duckdb::RemapColumnInfo,_std::allocator<duckdb::RemapColumnInfo>_>
               ._M_impl.super__Vector_impl_data._M_start;
  pp_Var1[2] = (_func_int *)
               local_38.
               super__Vector_base<duckdb::RemapColumnInfo,_std::allocator<duckdb::RemapColumnInfo>_>
               ._M_impl.super__Vector_impl_data._M_finish;
  pp_Var1[3] = (_func_int *)
               local_38.
               super__Vector_base<duckdb::RemapColumnInfo,_std::allocator<duckdb::RemapColumnInfo>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_38.super__Vector_base<duckdb::RemapColumnInfo,_std::allocator<duckdb::RemapColumnInfo>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38.super__Vector_base<duckdb::RemapColumnInfo,_std::allocator<duckdb::RemapColumnInfo>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38.super__Vector_base<duckdb::RemapColumnInfo,_std::allocator<duckdb::RemapColumnInfo>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::std::vector<duckdb::RemapColumnInfo,_std::allocator<duckdb::RemapColumnInfo>_>::~vector
            (&local_38);
  (this->super_FunctionData)._vptr_FunctionData = pp_Var1;
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)this;
}

Assistant:

unique_ptr<FunctionData> Copy() const override {
		return make_uniq<RemapStructBindData>(remap_info);
	}